

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O2

void extractDescriptor(Mat *in,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPointRotation
                      ,vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor)

{
  pointer *this;
  float fVar1;
  Point2f PVar2;
  pointer pKVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int n;
  long lVar7;
  int iVar8;
  pointer pKVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  allocator_type local_2f9;
  vector<float,_std::allocator<float>_> bin;
  undefined8 local_2a8;
  undefined8 local_2a0;
  Point2f local_298;
  undefined8 uStack_290;
  vector<float,_std::allocator<float>_> gridBin;
  Mat angle;
  long local_200;
  long *local_1c8;
  Mat M;
  long local_1a0;
  long *local_168;
  Mat window;
  long local_140;
  long *local_108;
  Mat matBin;
  void *local_e0;
  Mat gKernel;
  
  cv::Mat::Mat(&gKernel);
  pKVar9 = (keyPointRotation->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pKVar3 = (keyPointRotation->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pKVar9 == pKVar3) break;
    PVar2 = pKVar9->pt;
    fVar15 = PVar2.x;
    fVar16 = PVar2.y;
    if ((((8.0 < fVar15) && (fVar15 < (float)(*(int *)(in + 0xc) + -9))) && (8.0 < fVar16)) &&
       (fVar16 < (float)(*(int *)(in + 8) + -9))) {
      fVar1 = pKVar9->angle;
      uStack_290 = 0;
      local_2a8 = CONCAT44((int)(fVar16 + -8.0 + -1.0),(int)(fVar15 + -8.0 + -1.0));
      local_2a0 = 0x1200000012;
      local_298 = PVar2;
      cv::Mat::Mat(&window,in,(Rect_ *)&local_2a8);
      gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                   .super__Vector_impl_data._M_start._4_4_,0x2010000);
      gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&window;
      cv::Mat::convertTo((_OutputArray *)&window,(int)(Descriptor *)&gridBin,1.0,0.0);
      cv::Mat::Mat(&M,0x10,0x10,5);
      cv::Mat::Mat(&angle,0x10,0x10,5);
      lVar13 = 2;
      lVar5 = 0;
      lVar10 = 1;
      while (lVar10 != 0x11) {
        for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 4) {
          lVar6 = *local_108;
          lVar4 = lVar6 * lVar10 + local_140;
          fVar15 = *(float *)(lVar12 + 4 + lVar13 * lVar6 + local_140) -
                   *(float *)(lVar12 + 4 + lVar5 * lVar6 + local_140);
          fVar16 = *(float *)(lVar12 + 8 + lVar4) - *(float *)(lVar12 + lVar4);
          *(float *)(lVar12 + *local_168 * lVar5 + local_1a0) =
               SQRT(fVar16 * fVar16 + fVar15 * fVar15);
          fVar15 = atan2f(fVar15,fVar16);
          fVar15 = (fVar15 * 180.0) / 3.1415927;
          fVar15 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar15 |
                          (uint)(fVar15 + 360.0) & -(uint)(fVar15 < 0.0)) - fVar1;
          *(uint *)(lVar12 + *local_1c8 * lVar5 + local_200) =
               ~-(uint)(fVar15 < 0.0) & (uint)fVar15 |
               (uint)(fVar15 + 360.0) & -(uint)(fVar15 < 0.0);
        }
        lVar5 = lVar5 + 1;
        lVar13 = lVar13 + 1;
        lVar10 = lVar10 + 1;
      }
      bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (uVar14 = 0; uVar14 < 0x10; uVar14 = uVar14 + 4) {
        lVar13 = 0;
        for (uVar11 = 0; uVar11 < 0x10; uVar11 = uVar11 + 4) {
          _matBin = 0;
          std::vector<float,_std::allocator<float>_>::vector
                    (&gridBin,8,(value_type_conflict *)&matBin,&local_2f9);
          lVar10 = *local_1c8;
          lVar5 = *local_168;
          lVar12 = uVar14 * lVar5 + lVar13 + local_1a0;
          lVar6 = uVar14 * lVar10 + lVar13 + local_200;
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
              iVar8 = (int)(*(float *)(lVar6 + lVar7 * 4) / 45.0);
              gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[iVar8] =
                   *(float *)(lVar12 + lVar7 * 4) +
                   gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar8];
            }
            lVar12 = lVar12 + lVar5;
            lVar6 = lVar6 + lVar10;
          }
          std::vector<float,std::allocator<float>>::
          insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,void>
                    ((vector<float,std::allocator<float>> *)&bin,
                     (const_iterator)
                     bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&gridBin);
          lVar13 = lVar13 + 0x10;
        }
      }
      normVector(&bin);
      this = &gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      for (lVar13 = 0;
          (long)bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != lVar13; lVar13 = lVar13 + 1) {
        if (0.2 < bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13]) {
          bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = 0.2;
        }
      }
      normVector(&bin);
      cv::Mat::Mat(&matBin,1,0x80,5);
      memcpy(local_e0,bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
             (long)bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)bin.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
      gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44((int)local_298.y,(int)local_298.x);
      gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)gridBin.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                   .super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      cv::Mat::Mat((Mat *)this,&matBin);
      std::vector<Descriptor,_std::allocator<Descriptor>_>::emplace_back<Descriptor>
                (keyPointDescriptor,(Descriptor *)&gridBin);
      cv::Mat::~Mat((Mat *)this);
      cv::Mat::~Mat(&matBin);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&bin.super__Vector_base<float,_std::allocator<float>_>);
      cv::Mat::~Mat(&angle);
      cv::Mat::~Mat(&M);
      cv::Mat::~Mat(&window);
    }
    pKVar9 = pKVar9 + 1;
  }
  cv::Mat::~Mat(&gKernel);
  return;
}

Assistant:

void extractDescriptor(const Mat& in, const vector<KeyPoint>& keyPointRotation, vector<Descriptor>& keyPointDescriptor) {
	int wSize = 18;
	int halfWSize = (wSize - 2) / 2;
	int nBin = 36;
	int intervalBin = 360 / nBin;
	Mat gKernel;
	//getGaussianWeight(gKernel, wSize-2);
	
	for (KeyPoint point : keyPointRotation) {
		//discard key points to avoid corner conditions
		if (point.pt.x <= halfWSize || point.pt.x >= in.cols - halfWSize - 1 || point.pt.y <= halfWSize || point.pt.y >= in.rows - halfWSize - 1) continue;

		Rect patch = Rect(point.pt.x - halfWSize - 1, point.pt.y - halfWSize - 1, wSize, wSize);
		Mat window = Mat(in, patch);
		window.convertTo(window, CV_32F);
		Mat M = Mat(wSize-2, wSize-2, CV_32F);
		Mat angle = Mat(wSize-2, wSize-2, CV_32F);

		for (int i = 1; i < wSize-1; ++i) {
			for (int j = 1; j < wSize-1; ++j) {
				float diffI = window.at<float>(i + 1, j) - window.at<float>(i - 1, j);
				float diffJ = window.at<float>(i, j + 1) - window.at<float>(i, j - 1);
				float m = sqrt(pow(diffI, 2.0) + pow(diffJ, 2.0));
				M.at<float>(i - 1, j - 1) = m; //*gKernel.at<float>(i - 1, j - 1);
				float theta = atan2(diffI, diffJ) * 180 / M_PI;
				if (theta < 0) theta += 360;

				//normalize rotation
				theta -= point.angle;
				if (theta < 0) theta += 360;
				angle.at<float>(i - 1, j - 1) = theta;
			}
		}

		vector<float> bin;

		for (int i = 0; i < wSize-2; i+=4) {
			for (int j = 0; j < wSize-2; j+=4) {
				vector<float> gridBin(8,0);
				for (int m = 0; m < 4; ++m) {
					for (int n = 0; n < 4; ++n) {
						int pI = i + m;
						int pJ = j + n;
						int binIdx = static_cast<int>(angle.at<float>(pI , pJ) / 45);
						gridBin[binIdx] += M.at<float>(pI,pJ);
					}
				}
				bin.insert(bin.end(), gridBin.begin(), gridBin.end());
			}
		}

		//normalize+contrast invariance
		normVector(bin);
		for (int i = 0; i < bin.size(); ++i) {
			if (bin[i] > 0.2) bin[i] = 0.2;
		}
		normVector(bin);

		Mat matBin = Mat(1,128,CV_32F);
		//copy vector to mat in one row instead of one col
		memcpy(matBin.data, bin.data(), bin.size() * sizeof(float));

		keyPointDescriptor.push_back(Descriptor(point.pt.x, point.pt.y, matBin));
	}

}